

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O0

Point2 __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,Point2 *pred,
          Point2 *corr)

{
  bool bVar1;
  bool bVar2;
  Scalar_conflict3 *pSVar3;
  PredictionSchemeNormalOctahedronTransformBase<int> *this_00;
  Point2 *in_RCX;
  Point2 *in_RDX;
  PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *in_RSI;
  _Type in_RDI;
  int32_t reverse_rotation_count;
  int32_t rotation_count;
  bool pred_is_in_bottom_left;
  bool pred_is_in_diamond;
  Point2 t;
  Point2 *orig;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  PredictionSchemeNormalOctahedronTransformBase<int> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  Scalar_conflict3 a;
  undefined4 in_stack_ffffffffffffff4c;
  Scalar_conflict3 a_00;
  VectorD<int,_2> *in_stack_ffffffffffffff50;
  array<int,_2UL> this_01;
  undefined8 local_7c;
  undefined8 local_6c;
  undefined8 local_50;
  undefined8 local_38;
  
  this_01._M_elems = in_RDI;
  PredictionSchemeNormalOctahedronTransformBase<int>::center_value
            ((PredictionSchemeNormalOctahedronTransformBase<int> *)0x1f7020);
  PredictionSchemeNormalOctahedronTransformBase<int>::center_value
            ((PredictionSchemeNormalOctahedronTransformBase<int> *)0x1f7031);
  VectorD<int,_2>::VectorD
            ((VectorD<int,_2> *)in_RDI,(Scalar_conflict3 *)in_RCX,
             (Scalar_conflict3 *)in_stack_ffffffffffffff50);
  VectorD<int,_2>::operator-((VectorD<int,_2> *)this_01._M_elems,(Self *)in_RDI);
  *(undefined8 *)(in_RDX->v_)._M_elems = local_38;
  VectorD<int,_2>::operator[]
            ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  VectorD<int,_2>::operator[]
            ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  bVar1 = PredictionSchemeNormalOctahedronTransformBase<int>::IsInDiamond
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  if (!bVar1) {
    in_stack_ffffffffffffff50 =
         (VectorD<int,_2> *)
         VectorD<int,_2>::operator[]
                   ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    VectorD<int,_2>::operator[]
              ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    PredictionSchemeNormalOctahedronTransformBase<int>::InvertDiamond
              (in_stack_ffffffffffffff40,
               (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(int *)0x1f70f0)
    ;
  }
  bVar2 = PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::IsInBottomLeft
                    ((PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (Point2 *)in_stack_ffffffffffffff40);
  VectorD<int,_2>::VectorD
            (in_stack_ffffffffffffff50,
             (Self *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::GetRotationCount
            ((PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int> *)in_RDI,in_RCX);
  if (!bVar2) {
    VectorD<int,_2>::VectorD
              (in_stack_ffffffffffffff50,
               (Self *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::RotatePoint
              (in_RSI,in_RDX,this_01._M_elems[1]);
    *(undefined8 *)(in_RDX->v_)._M_elems = local_50;
  }
  pSVar3 = VectorD<int,_2>::operator[]
                     ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  a = *pSVar3;
  pSVar3 = VectorD<int,_2>::operator[]
                     ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  AddAsUnsigned<int,_nullptr>(a,*pSVar3);
  PredictionSchemeNormalOctahedronTransformBase<int>::ModMax
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  pSVar3 = VectorD<int,_2>::operator[]
                     ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  a_00 = *pSVar3;
  pSVar3 = VectorD<int,_2>::operator[]
                     ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  AddAsUnsigned<int,_nullptr>(a_00,*pSVar3);
  PredictionSchemeNormalOctahedronTransformBase<int>::ModMax
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  VectorD<int,_2>::VectorD
            ((VectorD<int,_2> *)in_RDI,(Scalar_conflict3 *)in_RCX,
             (Scalar_conflict3 *)in_stack_ffffffffffffff50);
  if (!bVar2) {
    VectorD<int,_2>::VectorD(in_stack_ffffffffffffff50,(Self *)CONCAT44(a_00,a));
    PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>::RotatePoint
              (in_RSI,in_RDX,this_01._M_elems[1]);
    *(undefined8 *)in_RDI = local_6c;
  }
  if (!bVar1) {
    this_00 = (PredictionSchemeNormalOctahedronTransformBase<int> *)
              VectorD<int,_2>::operator[]
                        ((VectorD<int,_2> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    VectorD<int,_2>::operator[]((VectorD<int,_2> *)this_00,in_stack_ffffffffffffff3c);
    PredictionSchemeNormalOctahedronTransformBase<int>::InvertDiamond
              (this_00,(int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (int *)0x1f7292);
  }
  VectorD<int,_2>::operator+((VectorD<int,_2> *)this_01._M_elems,(Self *)in_RDI);
  *(undefined8 *)in_RDI = local_7c;
  return (Point2)(array<int,_2UL>)this_01._M_elems;
}

Assistant:

Point2 ComputeOriginalValue(Point2 pred, Point2 corr) const {
    const Point2 t(this->center_value(), this->center_value());
    pred = pred - t;
    const bool pred_is_in_diamond = this->IsInDiamond(pred[0], pred[1]);
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&pred[0], &pred[1]);
    }
    const bool pred_is_in_bottom_left = this->IsInBottomLeft(pred);
    const int32_t rotation_count = this->GetRotationCount(pred);
    if (!pred_is_in_bottom_left) {
      pred = this->RotatePoint(pred, rotation_count);
    }
    Point2 orig(this->ModMax(AddAsUnsigned(pred[0], corr[0])),
                this->ModMax(AddAsUnsigned(pred[1], corr[1])));
    if (!pred_is_in_bottom_left) {
      const int32_t reverse_rotation_count = (4 - rotation_count) % 4;
      orig = this->RotatePoint(orig, reverse_rotation_count);
    }
    if (!pred_is_in_diamond) {
      this->InvertDiamond(&orig[0], &orig[1]);
    }
    orig = orig + t;
    return orig;
  }